

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O3

void __thiscall chrono::ChBodyAuxRef::SetFrame_COG_to_REF(ChBodyAuxRef *this,ChFrame<double> *mloc)

{
  ChBodyFrame *this_00;
  ChFrameMoving<double> *local;
  double dVar1;
  double dVar2;
  pointer psVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar24;
  ChFrameMoving<double> cog_oldnew;
  ChFrameMoving<double> tmpref_to_abs;
  ChVector<double> local_498;
  ChFrameMoving<double> local_480;
  double local_388;
  double dStack_380;
  double dStack_378;
  double dStack_370;
  double dStack_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  ChQuaternion<double> local_340;
  undefined1 local_320 [24];
  double dStack_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double local_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double local_2a0;
  double local_298;
  double dStack_290;
  double dStack_288;
  double dStack_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  double dStack_230;
  ChFrameMoving<double> local_228;
  ChFrameMoving<double> local_128;
  
  local_480.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
       coord.pos.m_data[0];
  local_480.super_ChFrame<double>.coord.pos.m_data[1] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.pos.m_data + 8);
  local_480.super_ChFrame<double>.coord.pos.m_data[2] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.pos.m_data + 0x10);
  local_480.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
       coord.rot.m_data[0];
  this_00 = &(this->super_ChBody).super_ChBodyFrame;
  local_480.super_ChFrame<double>.coord.rot.m_data[1] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.rot.m_data + 8);
  local_480.super_ChFrame<double>.coord.rot.m_data[2] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.rot.m_data + 0x10);
  local_480.super_ChFrame<double>.coord.rot.m_data[3] =
       *(double *)
        ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
               super_ChFrame<double>.coord.rot.m_data + 0x18);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
       Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x18);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x28);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x38);
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
  local_480.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_480.coord_dt.pos.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
  local_480.coord_dt.pos.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
  local_480.coord_dt.pos.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
  local_480.coord_dt.rot.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
  local_480.coord_dt.rot.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
  local_480.coord_dt.rot.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
  local_480.coord_dt.rot.m_data[3] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
  local_480.coord_dtdt.pos.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data[0];
  local_480.coord_dtdt.pos.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data[1];
  local_480.coord_dtdt.pos.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data[2];
  local_480.coord_dtdt.rot.m_data[0] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[0];
  local_480.coord_dtdt.rot.m_data[1] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[1];
  local_480.coord_dtdt.rot.m_data[2] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[2];
  local_480.coord_dtdt.rot.m_data[3] =
       (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data[3];
  local_320._0_8_ = (_func_int **)0x3ff0000000000000;
  local_228.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  dStack_308 = 0.0;
  local_320._8_16_ = ZEXT816(0) << 0x20;
  local_228.super_ChFrame<double>._0_16_ = local_320._8_16_;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_228,(ChQuaternion<double> *)local_320);
  local = &this->auxref_to_cog;
  ChFrameMoving<double>::TransformLocalToParent
            (&this_00->super_ChFrameMoving<double>,local,&local_128);
  local_320._8_16_ = *(undefined1 (*) [16])(mloc->coord).pos.m_data;
  dStack_308 = (mloc->coord).pos.m_data[2];
  dStack_300 = (mloc->coord).rot.m_data[0];
  local_2f8 = (mloc->coord).rot.m_data[1];
  dStack_2f0 = (mloc->coord).rot.m_data[2];
  local_2e8 = (mloc->coord).rot.m_data[3];
  local_2e0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  dStack_2d8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  dStack_2d0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
  dStack_2c8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  dStack_2c0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  dStack_2b8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  dStack_2b0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
  dStack_2a8 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  local_2a0 = (mloc->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  local_320._0_8_ = &PTR__ChFrame_00b036f0;
  local_298 = 0.0;
  dStack_290 = 0.0;
  dStack_288 = 0.0;
  dStack_280 = 0.0;
  dStack_278 = 0.0;
  dStack_270 = 0.0;
  dStack_268 = 0.0;
  dStack_260 = 0.0;
  dStack_258 = 0.0;
  dStack_250 = 0.0;
  dStack_248 = 0.0;
  dStack_240 = 0.0;
  dStack_238 = 0.0;
  dStack_230 = 0.0;
  ChFrameMoving<double>::TransformLocalToParent
            (&local_128,(ChFrameMoving<double> *)local_320,&this_00->super_ChFrameMoving<double>);
  dVar2 = *(double *)
           ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                   super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
  dVar8 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
          coord.pos.m_data[0];
  dVar9 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.pos.m_data + 8);
  dVar10 = *(double *)
            ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                   super_ChFrame<double>.coord.pos.m_data + 0x10);
  dVar11 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
           coord.rot.m_data[0];
  dVar4 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.rot.m_data + 8);
  dVar5 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.rot.m_data + 0x10);
  dVar1 = *(double *)
           ((long)(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                  super_ChFrame<double>.coord.rot.m_data + 0x18);
  dVar16 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
           Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar17 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8);
  dVar18 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
  dVar19 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x18);
  dVar20 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
  dVar21 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x28);
  dVar22 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
  dVar23 = *(double *)
            ((long)&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x38);
  local_388 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.m_data
              [0];
  dStack_380 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.
               m_data[1];
  dStack_378 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.pos.
               m_data[2];
  dStack_370 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.
               m_data[0];
  dStack_368 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.
               m_data[1];
  dStack_360 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.
               m_data[2];
  dStack_358 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dt.rot.
               m_data[3];
  dStack_350 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.
               m_data[0];
  dVar12 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data
           [1];
  dVar13 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.pos.m_data
           [2];
  dVar14 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
           [0];
  dVar15 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
           [1];
  dVar6 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
          [2];
  dVar7 = (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.coord_dtdt.rot.m_data
          [3];
  ChFrame<double>::GetInverse((ChFrame<double> *)local_320,mloc);
  ChFrameMoving<double>::operator=(local,(ChFrame<double> *)local_320);
  ChFrameMoving<double>::TransformLocalToParent
            (&this_00->super_ChFrameMoving<double>,local,&this->auxref_to_abs);
  local_228.super_ChFrame<double>.coord.pos.m_data[0] = dVar8;
  local_228.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_228.coord_dt.pos.m_data[0] = local_388;
  local_228.coord_dt.pos.m_data[1] = dStack_380;
  local_228.coord_dt.pos.m_data[2] = dStack_378;
  local_228.coord_dt.rot.m_data[0] = dStack_370;
  local_228.coord_dt.rot.m_data[1] = dStack_368;
  local_228.coord_dt.rot.m_data[2] = dStack_360;
  local_228.coord_dt.rot.m_data[3] = dStack_358;
  local_228.coord_dtdt.pos.m_data[0] = dStack_350;
  local_228.super_ChFrame<double>.coord.pos.m_data[1] = dVar9;
  local_228.super_ChFrame<double>.coord.pos.m_data[2] = dVar10;
  local_228.super_ChFrame<double>.coord.rot.m_data[0] = dVar11;
  local_228.super_ChFrame<double>.coord.rot.m_data[1] = dVar4;
  local_228.super_ChFrame<double>.coord.rot.m_data[2] = dVar5;
  local_228.super_ChFrame<double>.coord.rot.m_data[3] = dVar1;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar16;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar17;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar18;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar19;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar20;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar21;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar22;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar23;
  local_228.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar2;
  local_228.coord_dtdt.pos.m_data[1] = dVar12;
  local_228.coord_dtdt.pos.m_data[2] = dVar13;
  local_228.coord_dtdt.rot.m_data[0] = dVar14;
  local_228.coord_dtdt.rot.m_data[1] = dVar15;
  local_228.coord_dtdt.rot.m_data[2] = dVar6;
  local_228.coord_dtdt.rot.m_data[3] = dVar7;
  ChFrameMoving<double>::Invert(&local_228);
  local_340.m_data[0] = 1.0;
  local_498.m_data[0] = 0.0;
  local_498.m_data[1] = 0.0;
  local_498.m_data[2] = 0.0;
  local_340.m_data[1] = 0.0;
  local_340.m_data[2] = 0.0;
  local_340.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving((ChFrameMoving<double> *)local_320,&local_498,&local_340);
  ChFrameMoving<double>::TransformLocalToParent
            (&local_228,&local_480,(ChFrameMoving<double> *)local_320);
  psVar24 = (this->super_ChBody).marklist.
            super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->super_ChBody).marklist.
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar24 != psVar3) {
    do {
      ChFrameMoving<double>::ConcatenatePreTransformation
                (&((psVar24->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ChFrameMoving<double>,(ChFrameMoving<double> *)local_320);
      ChMarker::Update((psVar24->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,(this->super_ChBody).super_ChPhysicsItem.super_ChObj.ChTime);
      psVar24 = psVar24 + 1;
    } while (psVar24 != psVar3);
  }
  return;
}

Assistant:

void ChBodyAuxRef::SetFrame_COG_to_REF(const ChFrame<>& mloc) {
    ChFrameMoving<> old_cog_to_abs = *this;

    ChFrameMoving<> tmpref_to_abs;
    this->TransformLocalToParent(this->auxref_to_cog, tmpref_to_abs);
    tmpref_to_abs.TransformLocalToParent(ChFrameMoving<>(mloc), *this);
    // or, also, using overloaded operators for frames:
    //   tmpref_to_abs = auxref_to_cog >> *this;
    //   *this         = ChFrameMoving<>(mloc) >> tmpref_to_abs;

    ChFrameMoving<> new_cog_to_abs = *this;

    auxref_to_cog = mloc.GetInverse();
    this->TransformLocalToParent(this->auxref_to_cog, this->auxref_to_abs);
    // or, also, using overloaded operators for frames:
    //   *this->auxref_to_abs = this->auxref_to_cog.GetInverse() >> this;

    // Restore marker/forces positions, keeping unchanged respect to aux ref.
    ChFrameMoving<> cog_oldnew = old_cog_to_abs >> new_cog_to_abs.GetInverse();

    for (auto& marker : marklist) {
        marker->ConcatenatePreTransformation(cog_oldnew);
        marker->Update(ChTime);
    }

    // Forces: ?? to do...
    /*
    HIER_FORCE_INIT
    while (HIER_FORCE_NOSTOP)
    {
        FORCEpointer->
        FORCEpointer->Update (mytime);

        HIER_FORCE_NEXT
    }
    */
}